

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

bool __thiscall CConsole::ArgStringIsValid(CConsole *this,char *pFormat)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  bool Last;
  bool Valid;
  char Command;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined6 in_stack_ffffffffffffffd8;
  byte bVar4;
  bool local_12;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = *in_RSI;
  local_12 = true;
  bVar4 = 0;
  while( true ) {
    if ((local_12 == false) || (cVar1 == '\0')) goto LAB_0013abc6;
    if (((bVar4 & 1) != 0) && (*in_RSI != '\0')) break;
    if (cVar1 == '?') {
      if (in_RSI[1] == '\0') {
        local_12 = false;
        goto LAB_0013abc6;
      }
    }
    else if (((cVar1 != 'i') && (cVar1 != 'f')) && (cVar1 != 's')) {
      if (cVar1 != 'r') {
        local_12 = false;
        goto LAB_0013abc6;
      }
      bVar4 = 1;
    }
    bVar3 = NextParam((CConsole *)CONCAT17(local_12,CONCAT16(bVar4,in_stack_ffffffffffffffd8)),
                      in_RDI,(char **)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8))
    ;
    local_12 = (bool)((bVar3 ^ 0xffU) & 1);
  }
  local_12 = false;
LAB_0013abc6:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_12;
}

Assistant:

bool CConsole::ArgStringIsValid(const char *pFormat)
{
	char Command = *pFormat;
	bool Valid = true;
	bool Last = false;

	while(Valid)
	{
		if(!Command)
			break;

		if(Last && *pFormat)
			return false;

		if(Command == '?')
		{
			if(!pFormat[1])
				return false;
		}
		else
		{
			if(Command == 'i' || Command == 'f' || Command == 's')
				;
			else if(Command == 'r')
				Last = true;
			else
				return false;
		}

		Valid = !NextParam(&Command, pFormat);
	}

	return Valid;
}